

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_add_ratio(REF_HISTOGRAM ref_histogram,REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL ratio;
  REF_INT part;
  REF_INT edge;
  REF_EDGE ref_edge;
  REF_GRID ref_grid_local;
  REF_HISTOGRAM ref_histogram_local;
  
  ref_edge = (REF_EDGE)ref_grid;
  ref_grid_local = (REF_GRID)ref_histogram;
  uVar1 = ref_edge_create((REF_EDGE *)&part,ref_grid);
  if (uVar1 == 0) {
    for (ratio._4_4_ = 0; ratio._4_4_ < _part->n; ratio._4_4_ = ratio._4_4_ + 1) {
      uVar1 = ref_edge_part(_part,ratio._4_4_,(REF_INT *)&ratio);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x184,"ref_histogram_add_ratio",(ulong)uVar1,"edge part");
        return uVar1;
      }
      if (ratio._0_4_ == *(int *)(*(long *)ref_edge + 4)) {
        uVar1 = ref_node_ratio((REF_NODE)ref_edge->e2n,_part->e2n[ratio._4_4_ << 1],
                               _part->e2n[ratio._4_4_ * 2 + 1],
                               (REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x189,"ref_histogram_add_ratio",(ulong)uVar1,"rat");
          return uVar1;
        }
        uVar1 = ref_histogram_add((REF_HISTOGRAM)ref_grid_local,_ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x192,"ref_histogram_add_ratio",(ulong)uVar1,"add");
          printf("ratio %e at %f %f %f\n",_ref_private_macro_code_rss_1,
                 *(undefined8 *)
                  (*(long *)(ref_edge->e2n + 0xe) + (long)(_part->e2n[ratio._4_4_ << 1] * 0xf) * 8),
                 *(undefined8 *)
                  (*(long *)(ref_edge->e2n + 0xe) +
                  (long)(_part->e2n[ratio._4_4_ << 1] * 0xf + 1) * 8),
                 *(undefined8 *)
                  (*(long *)(ref_edge->e2n + 0xe) +
                  (long)(_part->e2n[ratio._4_4_ << 1] * 0xf + 2) * 8));
          return uVar1;
        }
      }
    }
    uVar1 = ref_histogram_gather((REF_HISTOGRAM)ref_grid_local,*(REF_MPI *)ref_edge);
    if (uVar1 == 0) {
      for (ratio._4_4_ = 0; ratio._4_4_ < _part->n; ratio._4_4_ = ratio._4_4_ + 1) {
        uVar1 = ref_edge_part(_part,ratio._4_4_,(REF_INT *)&ratio);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x199,"ref_histogram_add_ratio",(ulong)uVar1,"edge part");
          return uVar1;
        }
        if (ratio._0_4_ == *(int *)(*(long *)ref_edge + 4)) {
          uVar1 = ref_node_ratio((REF_NODE)ref_edge->e2n,_part->e2n[ratio._4_4_ << 1],
                                 _part->e2n[ratio._4_4_ * 2 + 1],
                                 (REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                   ,0x19e,"ref_histogram_add_ratio",(ulong)uVar1,"rat");
            return uVar1;
          }
          uVar1 = ref_histogram_add_stat
                            ((REF_HISTOGRAM)ref_grid_local,_ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                   ,0x19f,"ref_histogram_add_ratio",(ulong)uVar1,"add");
            return uVar1;
          }
        }
      }
      uVar1 = ref_histogram_gather_stat((REF_HISTOGRAM)ref_grid_local,*(REF_MPI *)ref_edge);
      if (uVar1 == 0) {
        ref_histogram_local._4_4_ = ref_edge_free(_part);
        if (ref_histogram_local._4_4_ == 0) {
          ref_histogram_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x1a5,"ref_histogram_add_ratio",(ulong)ref_histogram_local._4_4_,"free edge");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x1a3,"ref_histogram_add_ratio",(ulong)uVar1,"gather");
        ref_histogram_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x196,"ref_histogram_add_ratio",(ulong)uVar1,"gather");
      ref_histogram_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x181,"ref_histogram_add_ratio",(ulong)uVar1,"make edges");
    ref_histogram_local._4_4_ = uVar1;
  }
  return ref_histogram_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add_ratio(REF_HISTOGRAM ref_histogram,
                                           REF_GRID ref_grid) {
  REF_EDGE ref_edge;
  REF_INT edge, part;
  REF_DBL ratio;

  RSS(ref_edge_create(&ref_edge, ref_grid), "make edges");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      RSB(ref_histogram_add(ref_histogram, ratio), "add", {
        printf("ratio %e at %f %f %f\n", ratio,
               ref_node_xyz(ref_grid_node(ref_grid), 0,
                            ref_edge_e2n(ref_edge, 0, edge)),
               ref_node_xyz(ref_grid_node(ref_grid), 1,
                            ref_edge_e2n(ref_edge, 0, edge)),
               ref_node_xyz(ref_grid_node(ref_grid), 2,
                            ref_edge_e2n(ref_edge, 0, edge)));
      });
    }
  }

  RSS(ref_histogram_gather(ref_histogram, ref_grid_mpi(ref_grid)), "gather");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      RSS(ref_histogram_add_stat(ref_histogram, ratio), "add");
    }
  }
  RSS(ref_histogram_gather_stat(ref_histogram, ref_grid_mpi(ref_grid)),
      "gather");

  RSS(ref_edge_free(ref_edge), "free edge");

  return REF_SUCCESS;
}